

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateSectorFaceVertex
          (ON_SubD_FixedSizeHeap *this,ON_SubDFace *sector_face0)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *v1;
  double subdP [3];
  ON_SubDFace *sector_face0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  subdP[2] = (double)sector_face0;
  if (sector_face0 == (ON_SubDFace *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    bVar1 = ON_SubDFace::GetSubdivisionPoint(sector_face0,(double *)&v1);
    if (bVar1) {
      this_local = (ON_SubD_FixedSizeHeap *)AllocateVertex(this,(double *)&v1,3);
      if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else {
        uVar2 = ON_SubDComponentBase::SubdivisionLevel((ON_SubDComponentBase *)subdP[2]);
        ON_SubDComponentBase::SetSubdivisionLevel((ON_SubDComponentBase *)this_local,uVar2 + 1);
        ((ON_SubDVertex *)this_local)->m_vertex_tag = Smooth;
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubD_FixedSizeHeap *)0x0;
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex * ON_SubD_FixedSizeHeap::AllocateSectorFaceVertex(const ON_SubDFace * sector_face0)
{
  if (nullptr == sector_face0)
    return ON_SUBD_RETURN_ERROR(nullptr);
  double subdP[3];
  if (false == sector_face0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDVertex* v1 = AllocateVertex(subdP, 3 );
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( sector_face0->SubdivisionLevel() + 1 );
  v1->m_vertex_tag = ON_SubDVertexTag::Smooth;
  return v1;
}